

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,2>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  undefined1 *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FloatFormat *fmt_00;
  TestLog *this_01;
  MessageBuilder *pMVar6;
  reference ppFVar7;
  TestLog *this_02;
  ostream *poVar8;
  char *pcVar9;
  RenderContext *pRVar10;
  ulong uVar11;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *pVVar12;
  reference pvVar13;
  Variable<tcu::Matrix<float,_2,_2>_> *pVVar14;
  ShaderExecutor *pSVar15;
  undefined8 extraout_RAX;
  TestError *this_03;
  FloatFormat *pFVar16;
  IVal *pIVar17;
  const_reference pvVar18;
  IVal *value;
  reference value_00;
  TestLog *this_04;
  reference pvVar19;
  TestLog *this_05;
  TestLog *this_06;
  TestLog *this_07;
  double *value_01;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 uVar20;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 uVar22;
  undefined4 extraout_XMM0_Db_03;
  double dVar21;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  pointer local_15d8;
  MessageBuilder local_15c8;
  MessageBuilder local_1448;
  int local_12c4;
  MessageBuilder local_12c0;
  string local_1140;
  string local_1120;
  string local_1100;
  string local_10e0;
  string local_10c0;
  string local_10a0;
  string local_1080;
  string local_1060;
  string local_1040;
  string local_1020;
  string local_1000;
  string local_fe0;
  string local_fc0;
  string local_fa0;
  undefined1 local_f80 [8];
  MessageBuilder builder;
  string local_df8;
  IVal local_dd8;
  allocator<char> local_d71;
  string local_d70;
  undefined1 local_d48 [8];
  EvalContext ctx;
  IVal local_d00;
  IVal local_ca0;
  IVal local_c40;
  IVal local_be0;
  Void local_b79;
  undefined1 local_b78 [7];
  IVal reference1_1;
  IVal reference0_1;
  pointer pVStack_b10;
  bool result;
  size_t valueNdx;
  undefined1 local_b00 [7];
  IVal reference1;
  IVal reference0;
  undefined1 local_a98 [6];
  IVal in3;
  IVal in2;
  IVal in1;
  IVal in0;
  void *outputArr [2];
  void *inputArr [4];
  DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor> local_999;
  undefined1 local_998 [8];
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  executor;
  Symbol local_968;
  Symbol local_930;
  Symbol local_8f8;
  Symbol local_8c0;
  Symbol local_888;
  Symbol local_850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  ApiType local_7d4;
  string local_7d0 [32];
  ostringstream local_7b0 [8];
  ostringstream os;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_638;
  MessageBuilder local_618;
  _Self local_498;
  _Self local_490;
  const_iterator it;
  FuncSet funcs;
  ostringstream oss;
  MessageBuilder local_2e0;
  undefined1 local_160 [8];
  Environment env;
  int numErrors;
  int maxMsgs;
  FloatFormat highpFmt;
  undefined1 local_e8 [8];
  ShaderSpec spec;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  size_t numValues;
  int outCount;
  int inCount;
  FloatFormat *fmt;
  Statement *stmt_local;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *inputs_local;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_2,_2>,_tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *variables_local;
  PrecisionCase *this_local;
  
  fmt_00 = getFormat(this);
  iVar3 = numInputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,2,2>,tcu::Matrix<float,2,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
                    ();
  iVar4 = numOutputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,2>,deqp::gls::BuiltinPrecisionTests::Void>>
                    ();
  if (iVar3 < 1) {
    local_15d8 = (pointer)&DAT_00000001;
  }
  else {
    local_15d8 = (pointer)std::
                          vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                          ::size(&inputs->in0);
  }
  outputs.out1.
  super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_15d8;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs((Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
             *)((long)&spec.source.field_2 + 8),(size_t)local_15d8);
  ShaderExecUtil::ShaderSpec::ShaderSpec((ShaderSpec *)local_e8);
  highpFmt._24_8_ = (this->m_ctx).highpFormat.m_maxValue;
  numErrors = (this->m_ctx).highpFormat.m_minExp;
  unique0x1000149b = (this->m_ctx).highpFormat.m_maxExp;
  highpFmt.m_minExp = (this->m_ctx).highpFormat.m_fractionBits;
  highpFmt.m_maxExp = (this->m_ctx).highpFormat.m_hasSubnormal;
  highpFmt.m_fractionBits = (this->m_ctx).highpFormat.m_hasInf;
  highpFmt.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasNaN;
  highpFmt._16_8_ = *(undefined8 *)&(this->m_ctx).highpFormat.m_exactPrecision;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
  Environment::Environment((Environment *)local_160);
  switch(iVar3) {
  case 4:
  case 3:
  case 2:
  case 1:
  default:
    log(this,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    tcu::TestLog::operator<<(&local_2e0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_2e0,(char (*) [12])"Statement: ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,stmt);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_2e0);
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
    ::set((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
           *)&it);
    Statement::getUsedFuncs
              (stmt,(set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                     *)&it);
    local_490._M_node =
         (_Base_ptr)
         std::
         set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
         ::begin((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                  *)&it);
    while( true ) {
      local_498._M_node =
           (_Base_ptr)
           std::
           set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
           ::end((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                  *)&it);
      bVar1 = std::operator!=(&local_490,&local_498);
      if (!bVar1) break;
      ppFVar7 = std::_Rb_tree_const_iterator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>::
                operator*(&local_490);
      FuncBase::printDefinition
                (*ppFVar7,(ostream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::_Rb_tree_const_iterator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>::operator++
                (&local_490);
    }
    bVar1 = std::
            set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
            ::empty((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
                     *)&it);
    if (!bVar1) {
      log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
      tcu::TestLog::operator<<(&local_618,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_618,(char (*) [24])"Reference definitions:\n")
      ;
      std::__cxx11::ostringstream::str();
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_638);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_638);
      tcu::MessageBuilder::~MessageBuilder(&local_618);
    }
    std::
    set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
    ::~set((set<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
            *)&it);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)&funcs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::ostringstream::ostringstream(local_7b0);
    poVar8 = std::operator<<((ostream *)local_7b0,"precision ");
    pcVar9 = glu::getPrecisionName((this->m_ctx).precision);
    poVar8 = std::operator<<(poVar8,pcVar9);
    std::operator<<(poVar8," float;\n");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)
               &spec.outputs.
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,local_7d0);
    std::__cxx11::string::~string(local_7d0);
    std::__cxx11::ostringstream::~ostringstream(local_7b0);
    pRVar10 = getRenderContext(this);
    local_7d4.m_bits = (*pRVar10->_vptr_RenderContext[2])();
    local_e8._0_4_ = glu::getContextTypeGLSLVersion((ContextType)local_7d4.m_bits);
    uVar11 = std::__cxx11::string::empty();
    if ((uVar11 & 1) == 0) {
      std::operator+(&local_818,"#extension ",&this->m_extension);
      std::operator+(&local_7f8,&local_818," : require\n");
      std::__cxx11::string::operator=
                ((string *)
                 &spec.outputs.
                  super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_7f8);
      std::__cxx11::string::~string((string *)&local_818);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)&spec,(long)iVar3);
  switch(iVar3) {
  case 4:
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in3).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_850,this,pVVar12);
    pvVar13 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,3);
    ShaderExecUtil::Symbol::operator=(pvVar13,&local_850);
    ShaderExecUtil::Symbol::~Symbol(&local_850);
  case 3:
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_888,this,pVVar12);
    pvVar13 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,2);
    ShaderExecUtil::Symbol::operator=(pvVar13,&local_888);
    ShaderExecUtil::Symbol::~Symbol(&local_888);
  case 2:
    pVVar14 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
              ::operator*(&(variables->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                         );
    makeSymbol<tcu::Matrix<float,2,2>>(&local_8c0,this,pVVar14);
    pvVar13 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,1);
    ShaderExecUtil::Symbol::operator=(pvVar13,&local_8c0);
    ShaderExecUtil::Symbol::~Symbol(&local_8c0);
  case 1:
    pVVar14 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
              ::operator*((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           *)variables);
    makeSymbol<tcu::Matrix<float,2,2>>(&local_8f8,this,pVVar14);
    pvVar13 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec,0);
    ShaderExecUtil::Symbol::operator=(pvVar13,&local_8f8);
    ShaderExecUtil::Symbol::~Symbol(&local_8f8);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)&spec.inputs.
               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar4);
  if (iVar4 != 1) {
    if (iVar4 != 2) goto LAB_00b42ea0;
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->out1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    makeSymbol<deqp::gls::BuiltinPrecisionTests::Void>(&local_930,this,pVVar12);
    pvVar13 = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                            *)&spec.inputs.
                               super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    ShaderExecUtil::Symbol::operator=(pvVar13,&local_930);
    ShaderExecUtil::Symbol::~Symbol(&local_930);
  }
  pVVar14 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
            ::operator*(&(variables->out0).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                       );
  makeSymbol<tcu::Matrix<float,2,2>>(&local_968,this,pVVar14);
  pvVar13 = std::
            vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            ::operator[]((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                          *)&spec.inputs.
                             super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  ShaderExecUtil::Symbol::operator=(pvVar13,&local_968);
  ShaderExecUtil::Symbol::~Symbol(&local_968);
LAB_00b42ea0:
  de::toString<deqp::gls::BuiltinPrecisionTests::Statement>
            ((string *)
             &executor.
              super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
              .m_data.field_0x8,stmt);
  this_00 = &executor.
             super_UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
             .m_data.field_0x8;
  std::__cxx11::string::operator=
            ((string *)(spec.globalDeclarations.field_2._M_local_buf + 8),(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  pRVar10 = getRenderContext(this);
  pSVar15 = ShaderExecUtil::createExecutor(pRVar10,(this->m_ctx).shaderType,(ShaderSpec *)local_e8);
  de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>::DefaultDeleter(&local_999);
  de::details::
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  ::UniquePtr((UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
               *)local_998,pSVar15);
  outputArr[1] = std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::
                 front(&inputs->in0);
  std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::front
            (&inputs->in1);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::front(&inputs->in2);
  std::
  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
  ::front(&inputs->in3);
  in0.m_data.m_data[1].m_data[1].m_hi =
       (double)std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::
               front((vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_> *
                     )((long)&spec.source.field_2 + 8));
  outputArr[0] = std::
                 vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                 ::front((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          *)&outputs.out0.
                             super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pSVar15 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  dVar21 = log(this,(double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  (*pSVar15->_vptr_ShaderExecutor[3])(SUB84(dVar21,0),pSVar15,extraout_RAX);
  pSVar15 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  uVar5 = (*pSVar15->_vptr_ShaderExecutor[2])();
  if ((uVar5 & 1) == 0) {
    this_03 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_03,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pSVar15 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  (*pSVar15->_vptr_ShaderExecutor[5])();
  pSVar15 = de::details::
            UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
            ::operator->((UniqueBase<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                          *)local_998);
  value_01 = &in0.m_data.m_data[1].m_data[1].m_hi;
  (*pSVar15->_vptr_ShaderExecutor[6])
            (pSVar15,(ulong)outputs.out1.
                            super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffff,
             outputArr + 1);
  de::details::
  UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
  ::~UniquePtr((UniquePtr<deqp::gls::ShaderExecUtil::ShaderExecutor,_de::DefaultDeleter<deqp::gls::ShaderExecUtil::ShaderExecutor>_>
                *)local_998);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix
            ((Matrix<tcu::Interval,_2,_2> *)&in1.m_data.m_data[1].m_data[1].m_hi);
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_a98);
  Void::Void((Void *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 7));
  Void::Void((Void *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 6));
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_b00);
  Void::Void((Void *)((long)&valueNdx + 7));
  pVVar14 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
            ::operator*((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                         *)variables);
  Environment::bind<tcu::Matrix<float,2,2>>
            ((Environment *)local_160,pVVar14,(IVal *)&in1.m_data.m_data[1].m_data[1].m_hi);
  pVVar14 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
            ::operator*(&(variables->in1).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                       );
  Environment::bind<tcu::Matrix<float,2,2>>((Environment *)local_160,pVVar14,(IVal *)local_a98);
  pVVar12 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->in2).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar12,
             (IVal *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 7));
  pVVar12 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->in3).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar12,
             (IVal *)((long)&reference0.m_data.m_data[1].m_data[1].m_hi + 6));
  pVVar14 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
            ::operator*(&(variables->out0).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                       );
  Environment::bind<tcu::Matrix<float,2,2>>((Environment *)local_160,pVVar14,(IVal *)local_b00);
  pVVar12 = de::
            SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
            ::operator*(&(variables->out1).
                         super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                       );
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)local_160,pVVar12,(IVal *)((long)&valueNdx + 7));
  tcu::Matrix<tcu::Interval,_2,_2>::~Matrix((Matrix<tcu::Interval,_2,_2> *)local_b00);
  tcu::Matrix<tcu::Interval,_2,_2>::~Matrix((Matrix<tcu::Interval,_2,_2> *)local_a98);
  tcu::Matrix<tcu::Interval,_2,_2>::~Matrix
            ((Matrix<tcu::Interval,_2,_2> *)&in1.m_data.m_data[1].m_data[1].m_hi);
  pVStack_b10 = (pointer)0x0;
  uVar20 = extraout_XMM0_Da_02;
  uVar22 = extraout_XMM0_Db_02;
  do {
    if (outputs.out1.
        super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage <= pVStack_b10) {
      if (100 < (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count) {
        log(this,(double)CONCAT44(uVar22,uVar20));
        tcu::TestLog::operator<<(&local_12c0,this_05,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_12c0,(char (*) [10])"(Skipped ");
        local_12c4 = (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + -100;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_12c4);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [12])" messages.)");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_12c0);
        uVar20 = extraout_XMM0_Da_05;
        uVar22 = extraout_XMM0_Db_05;
      }
      if ((int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        log(this,(double)CONCAT44(uVar22,uVar20));
        tcu::TestLog::operator<<(&local_1448,this_06,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<(&local_1448,(char (*) [5])"All ");
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])" inputs passed.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1448);
      }
      else {
        log(this,(double)CONCAT44(uVar22,uVar20));
        tcu::TestLog::operator<<(&local_15c8,this_07,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_15c8,
                            (int *)&env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf02cfa);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(unsigned_long *)
                                   &outputs.out1.
                                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])" inputs failed.");
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_15c8);
      }
      Environment::~Environment((Environment *)local_160);
      ShaderExecUtil::ShaderSpec::~ShaderSpec((ShaderSpec *)local_e8);
      Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
      ::~Outputs((Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_2>,_deqp::gls::BuiltinPrecisionTests::Void>_>
                  *)((long)&spec.source.field_2 + 8));
      return;
    }
    bVar1 = true;
    tcu::Matrix<tcu::Interval,_2,_2>::Matrix((Matrix<tcu::Interval,_2,_2> *)local_b78);
    Void::Void(&local_b79);
    if (((ulong)pVStack_b10 & 0xfff) == 0) {
      tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestNode.m_testCtx);
    }
    pFVar16 = (FloatFormat *)
              std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::
              operator[](&inputs->in0,(size_type)pVStack_b10);
    round<tcu::Matrix<float,2,2>>
              (&local_c40,(BuiltinPrecisionTests *)fmt_00,pFVar16,(Matrix<float,_2,_2> *)value_01);
    convert<tcu::Matrix<float,2,2>>
              (&local_be0,(BuiltinPrecisionTests *)fmt_00,(FloatFormat *)&local_c40,(IVal *)value_01
              );
    pVVar14 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
              ::operator*((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           *)variables);
    pIVar17 = Environment::lookup<tcu::Matrix<float,2,2>>((Environment *)local_160,pVVar14);
    tcu::Matrix<tcu::Interval,_2,_2>::operator=(pIVar17,&local_be0);
    tcu::Matrix<tcu::Interval,_2,_2>::~Matrix(&local_be0);
    tcu::Matrix<tcu::Interval,_2,_2>::~Matrix(&local_c40);
    pFVar16 = (FloatFormat *)
              std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::
              operator[](&inputs->in1,(size_type)pVStack_b10);
    round<tcu::Matrix<float,2,2>>
              (&local_d00,(BuiltinPrecisionTests *)fmt_00,pFVar16,(Matrix<float,_2,_2> *)value_01);
    convert<tcu::Matrix<float,2,2>>
              (&local_ca0,(BuiltinPrecisionTests *)fmt_00,(FloatFormat *)&local_d00,(IVal *)value_01
              );
    pVVar14 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
              ::operator*(&(variables->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                         );
    pIVar17 = Environment::lookup<tcu::Matrix<float,2,2>>((Environment *)local_160,pVVar14);
    tcu::Matrix<tcu::Interval,_2,_2>::operator=(pIVar17,&local_ca0);
    tcu::Matrix<tcu::Interval,_2,_2>::~Matrix(&local_ca0);
    tcu::Matrix<tcu::Interval,_2,_2>::~Matrix(&local_d00);
    pvVar18 = std::
              vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator[](&inputs->in2,(size_type)pVStack_b10);
    round<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,pvVar18);
    convert<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,(IVal *)&ctx.field_0x3e);
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)local_160,pVVar12);
    pvVar18 = std::
              vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator[](&inputs->in3,(size_type)pVStack_b10);
    round<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,pvVar18);
    convert<deqp::gls::BuiltinPrecisionTests::Void>(fmt_00,(IVal *)((long)&ctx.callDepth + 2));
    pVVar12 = de::
              SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
              ::operator*(&(variables->in3).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                         );
    Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>((Environment *)local_160,pVVar12);
    value_01 = (double *)local_160;
    EvalContext::EvalContext
              ((EvalContext *)local_d48,fmt_00,(this->m_ctx).precision,(Environment *)value_01,0);
    Statement::execute(stmt,(EvalContext *)local_d48);
    dVar21 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
    if (iVar4 == 1) {
LAB_00b437b7:
      pVVar14 = de::
                SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                ::operator*(&(variables->out0).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                           );
      pFVar16 = (FloatFormat *)
                Environment::lookup<tcu::Matrix<float,2,2>>((Environment *)local_160,pVVar14);
      convert<tcu::Matrix<float,2,2>>
                (&local_dd8,(BuiltinPrecisionTests *)&numErrors,pFVar16,(IVal *)value_01);
      tcu::Matrix<tcu::Interval,_2,_2>::operator=
                ((Matrix<tcu::Interval,_2,_2> *)local_b78,&local_dd8);
      tcu::Matrix<tcu::Interval,_2,_2>::~Matrix(&local_dd8);
      value_00 = std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>::
                 operator[]((vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                             *)((long)&spec.source.field_2 + 8),(size_type)pVStack_b10);
      bVar2 = contains<tcu::Matrix<float,2,2>>((IVal *)local_b78,value_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_df8,"Shader output 0 is outside acceptable range",
                 (allocator<char> *)&builder.field_0x17f);
      bVar2 = tcu::ResultCollector::check(&this->m_status,bVar2,&local_df8);
      std::__cxx11::string::~string((string *)&local_df8);
      dVar21 = (double)std::allocator<char>::~allocator((allocator<char> *)&builder.field_0x17f);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        bVar1 = false;
      }
    }
    else if (iVar4 == 2) {
      pVVar12 = de::
                SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                ::operator*(&(variables->out1).
                             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                           );
      value = Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                        ((Environment *)local_160,pVVar12);
      convert<deqp::gls::BuiltinPrecisionTests::Void>((FloatFormat *)&numErrors,value);
      pvVar19 = std::
                vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                ::operator[]((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                              *)&outputs.out0.
                                 super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (size_type)pVStack_b10);
      bVar1 = contains<deqp::gls::BuiltinPrecisionTests::Void>(&local_b79,pvVar19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d70,"Shader output 1 is outside acceptable range",&local_d71);
      bVar1 = tcu::ResultCollector::check(&this->m_status,bVar1,&local_d70);
      std::__cxx11::string::~string((string *)&local_d70);
      std::allocator<char>::~allocator(&local_d71);
      bVar1 = ((bVar1 ^ 0xffU) & 1) == 0;
      goto LAB_00b437b7;
    }
    if ((!bVar1) &&
       (env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ =
             (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count + 1,
       (int)env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count < 0x65)) {
      log(this,dVar21);
      tcu::TestLog::message((MessageBuilder *)local_f80,this_04);
      pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_f80,(char (*) [7])"Failed");
      tcu::MessageBuilder::operator<<(pMVar6,(char (*) [10])" sample:\n");
      if (0 < iVar3) {
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_f80,(char (*) [2])0xf2b66e)
        ;
        pVVar14 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                  ::operator->((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                                *)variables);
        Variable<tcu::Matrix<float,2,2>>::getName_abi_cxx11_(&local_fa0,pVVar14);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_fa0);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0xf0b6ce);
        pFVar16 = (FloatFormat *)
                  std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                  ::operator[](&inputs->in0,(size_type)pVStack_b10);
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_fc0,(BuiltinPrecisionTests *)&numErrors,pFVar16,
                   (Matrix<float,_2,_2> *)value_01);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_fc0);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf12600);
        std::__cxx11::string::~string((string *)&local_fc0);
        std::__cxx11::string::~string((string *)&local_fa0);
      }
      if (1 < iVar3) {
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_f80,(char (*) [2])0xf2b66e)
        ;
        pVVar14 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                  ::operator->(&(variables->in1).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                              );
        Variable<tcu::Matrix<float,2,2>>::getName_abi_cxx11_(&local_fe0,pVVar14);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_fe0);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0xf0b6ce);
        pFVar16 = (FloatFormat *)
                  std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                  ::operator[](&inputs->in1,(size_type)pVStack_b10);
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_1000,(BuiltinPrecisionTests *)&numErrors,pFVar16,
                   (Matrix<float,_2,_2> *)value_01);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1000);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf12600);
        std::__cxx11::string::~string((string *)&local_1000);
        std::__cxx11::string::~string((string *)&local_fe0);
      }
      if (2 < iVar3) {
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_f80,(char (*) [2])0xf2b66e)
        ;
        pVVar12 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->in2).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_1020,pVVar12);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1020);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0xf0b6ce);
        pvVar18 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[](&inputs->in2,(size_type)pVStack_b10);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_1040,(FloatFormat *)&numErrors,pvVar18);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1040);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf12600);
        std::__cxx11::string::~string((string *)&local_1040);
        std::__cxx11::string::~string((string *)&local_1020);
      }
      if (3 < iVar3) {
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_f80,(char (*) [2])0xf2b66e)
        ;
        pVVar12 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->in3).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_1060,pVVar12);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1060);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0xf0b6ce);
        pvVar18 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[](&inputs->in3,(size_type)pVStack_b10);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_1080,(FloatFormat *)&numErrors,pvVar18);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1080);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf12600);
        std::__cxx11::string::~string((string *)&local_1080);
        std::__cxx11::string::~string((string *)&local_1060);
      }
      if (0 < iVar4) {
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_f80,(char (*) [2])0xf2b66e)
        ;
        pVVar14 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                  ::operator->(&(variables->out0).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_2>_>_>
                              );
        Variable<tcu::Matrix<float,2,2>>::getName_abi_cxx11_(&local_10a0,pVVar14);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_10a0);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0xf0b6ce);
        pFVar16 = (FloatFormat *)
                  std::vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                  ::operator[]((vector<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                *)((long)&spec.source.field_2 + 8),(size_type)pVStack_b10);
        valueToString<tcu::Matrix<float,2,2>>
                  (&local_10c0,(BuiltinPrecisionTests *)&numErrors,pFVar16,
                   (Matrix<float,_2,_2> *)value_01);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_10c0);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf12600);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])"\tExpected range: ");
        intervalToString<tcu::Matrix<float,2,2>>
                  (&local_10e0,(BuiltinPrecisionTests *)&numErrors,(FloatFormat *)local_b78,
                   (IVal *)value_01);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_10e0);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf12600);
        std::__cxx11::string::~string((string *)&local_10e0);
        std::__cxx11::string::~string((string *)&local_10c0);
        std::__cxx11::string::~string((string *)&local_10a0);
      }
      if (1 < iVar4) {
        pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_f80,(char (*) [2])0xf2b66e)
        ;
        pVVar12 = de::
                  SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator->(&(variables->out1).
                                super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                              );
        Variable<deqp::gls::BuiltinPrecisionTests::Void>::getName_abi_cxx11_(&local_1100,pVVar12);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1100);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [4])0xf0b6ce);
        pvVar19 = std::
                  vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                  ::operator[]((vector<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                                *)&outputs.out0.
                                   super__Vector_base<tcu::Matrix<float,_2,_2>,_std::allocator<tcu::Matrix<float,_2,_2>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (size_type)pVStack_b10);
        valueToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_1120,(FloatFormat *)&numErrors,pvVar19);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1120);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf12600);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [18])"\tExpected range: ");
        intervalToString<deqp::gls::BuiltinPrecisionTests::Void>
                  (&local_1140,(FloatFormat *)&numErrors,&local_b79);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_1140);
        tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf12600);
        std::__cxx11::string::~string((string *)&local_1140);
        std::__cxx11::string::~string((string *)&local_1120);
        std::__cxx11::string::~string((string *)&local_1100);
      }
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_f80,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_f80);
    }
    tcu::Matrix<tcu::Interval,_2,_2>::~Matrix((Matrix<tcu::Interval,_2,_2> *)local_b78);
    pVStack_b10 = pVStack_b10 + 1;
    uVar20 = extraout_XMM0_Da_04;
    uVar22 = extraout_XMM0_Db_04;
  } while( true );
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}